

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O0

void pffft_real_finalize(int Ncvec,v4sf *in,v4sf *out,v4sf *e)

{
  v4sf *pafVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  v4sf *pafVar7;
  v4sf *pafVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  v4sf save_next;
  float xi3;
  float xr3;
  float xi2;
  float xr2;
  float xi1;
  float xr1;
  float xi0;
  float xr0;
  v4sf zero;
  v4sf save;
  v4sf_union *uout;
  v4sf_union ci;
  v4sf_union cr;
  int local_107c;
  int dk;
  int k;
  v4sf *e_local;
  v4sf *out_local;
  v4sf *in_local;
  int Ncvec_local;
  v4sf tmp_5;
  v4sf tmp_4;
  v4sf tmp_3;
  __m128 tmp0_3;
  __m128 tmp1_3;
  __m128 tmp2_3;
  __m128 tmp3_3;
  __m128 tmp0_2;
  __m128 tmp1_2;
  __m128 tmp2_2;
  __m128 tmp3_2;
  v4sf di1_1;
  v4sf si1_1;
  v4sf di0_1;
  v4sf si0_1;
  v4sf dr1_1;
  v4sf sr1_1;
  v4sf dr0_1;
  v4sf sr0_1;
  v4sf i3_1;
  v4sf r3_1;
  v4sf i2_1;
  v4sf r2_1;
  v4sf i1_1;
  v4sf r1_1;
  v4sf i0_1;
  v4sf r0_1;
  float local_d08;
  float fStack_d04;
  float fStack_d00;
  float fStack_cfc;
  float local_ce8;
  float fStack_ce4;
  float fStack_ce0;
  float fStack_cdc;
  float local_cc8;
  float fStack_cc4;
  float fStack_cc0;
  float fStack_cbc;
  float local_ca8;
  float fStack_ca4;
  float fStack_ca0;
  float fStack_c9c;
  float local_c88;
  float fStack_c84;
  float fStack_c80;
  float fStack_c7c;
  float local_c68;
  float fStack_c64;
  float fStack_c60;
  float fStack_c5c;
  float local_c48;
  float fStack_c44;
  float fStack_c40;
  float fStack_c3c;
  float local_c28;
  float fStack_c24;
  float fStack_c20;
  float fStack_c1c;
  float local_c08;
  float fStack_c04;
  float fStack_c00;
  float fStack_bfc;
  float local_be8;
  float fStack_be4;
  float fStack_be0;
  float fStack_bdc;
  float local_bc8;
  float fStack_bc4;
  float fStack_bc0;
  float fStack_bbc;
  float local_ba8;
  float fStack_ba4;
  float fStack_ba0;
  float fStack_b9c;
  float local_b88;
  float fStack_b84;
  float local_b78;
  float fStack_b74;
  float local_b68;
  float fStack_b64;
  float local_b58;
  float fStack_b54;
  float local_b48;
  float fStack_b44;
  float local_b38;
  float fStack_b34;
  float local_b28;
  float fStack_b24;
  float local_b18;
  float fStack_b14;
  float fStack_b00;
  float fStack_afc;
  float fStack_af0;
  float fStack_aec;
  float fStack_ae0;
  float fStack_adc;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac0;
  float fStack_abc;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa0;
  float fStack_a9c;
  float fStack_a90;
  float fStack_a8c;
  v4sf tmp_2;
  v4sf tmp_1;
  v4sf tmp;
  __m128 tmp0_1;
  __m128 tmp1_1;
  __m128 tmp2_1;
  __m128 tmp3_1;
  __m128 tmp0;
  __m128 tmp1;
  __m128 tmp2;
  __m128 tmp3;
  v4sf di1;
  v4sf si1;
  v4sf di0;
  v4sf si0;
  v4sf dr1;
  v4sf sr1;
  v4sf dr0;
  v4sf sr0;
  v4sf i3;
  v4sf r3;
  v4sf i2;
  v4sf r2;
  v4sf i1;
  v4sf r1;
  v4sf i0;
  v4sf r0;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_368;
  float fStack_364;
  float local_358;
  float fStack_354;
  float local_348;
  float fStack_344;
  float local_328;
  float fStack_324;
  float local_318;
  float fStack_314;
  float local_308;
  float fStack_304;
  float fStack_2e0;
  float fStack_2dc;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c0;
  float fStack_2bc;
  float fStack_2a0;
  float fStack_29c;
  float fStack_290;
  float fStack_28c;
  float fStack_280;
  float fStack_27c;
  
  iVar6 = Ncvec;
  if (Ncvec < 0) {
    iVar6 = Ncvec + 3;
  }
  zero._8_8_ = *(undefined8 *)in[7];
  save._0_8_ = *(undefined8 *)(in[7] + 2);
  uVar2 = *(undefined8 *)*in;
  uVar3 = *(undefined8 *)(*in + 2);
  uVar4 = *(undefined8 *)in[Ncvec * 2 + -1];
  uVar5 = *(undefined8 *)(in[Ncvec * 2 + -1] + 2);
  if (in != out) {
    local_308 = (float)*(undefined8 *)in[1];
    fStack_304 = (float)((ulong)*(undefined8 *)in[1] >> 0x20);
    local_318 = (float)*(undefined8 *)in[3];
    fStack_314 = (float)((ulong)*(undefined8 *)in[3] >> 0x20);
    local_328 = (float)*(undefined8 *)in[5];
    fStack_324 = (float)((ulong)*(undefined8 *)in[5] >> 0x20);
    fStack_280 = (float)*(undefined8 *)(in[1] + 2);
    fStack_27c = (float)((ulong)*(undefined8 *)(in[1] + 2) >> 0x20);
    fStack_290 = (float)*(undefined8 *)(in[3] + 2);
    fStack_28c = (float)((ulong)*(undefined8 *)(in[3] + 2) >> 0x20);
    fStack_2a0 = (float)*(undefined8 *)(in[5] + 2);
    fStack_29c = (float)((ulong)*(undefined8 *)(in[5] + 2) >> 0x20);
    local_348 = (float)*(undefined8 *)in[2];
    fStack_344 = (float)((ulong)*(undefined8 *)in[2] >> 0x20);
    local_358 = (float)*(undefined8 *)in[4];
    fStack_354 = (float)((ulong)*(undefined8 *)in[4] >> 0x20);
    local_368 = (float)*(undefined8 *)in[6];
    fStack_364 = (float)((ulong)*(undefined8 *)in[6] >> 0x20);
    fStack_2c0 = (float)*(undefined8 *)(in[2] + 2);
    fStack_2bc = (float)((ulong)*(undefined8 *)(in[2] + 2) >> 0x20);
    fStack_2d0 = (float)*(undefined8 *)(in[4] + 2);
    fStack_2cc = (float)((ulong)*(undefined8 *)(in[4] + 2) >> 0x20);
    fStack_2e0 = (float)*(undefined8 *)(in[6] + 2);
    fStack_2dc = (float)((ulong)*(undefined8 *)(in[6] + 2) >> 0x20);
    local_388 = (float)*(undefined8 *)e[1];
    fStack_384 = (float)((ulong)*(undefined8 *)e[1] >> 0x20);
    fStack_380 = (float)*(undefined8 *)(e[1] + 2);
    fStack_37c = (float)((ulong)*(undefined8 *)(e[1] + 2) >> 0x20);
    local_3a8 = (float)*(undefined8 *)*e;
    fStack_3a4 = (float)((ulong)*(undefined8 *)*e >> 0x20);
    fStack_3a0 = (float)*(undefined8 *)(*e + 2);
    fStack_39c = (float)((ulong)*(undefined8 *)(*e + 2) >> 0x20);
    local_3c8 = (float)*(undefined8 *)e[1];
    fStack_3c4 = (float)((ulong)*(undefined8 *)e[1] >> 0x20);
    fStack_3c0 = (float)*(undefined8 *)(e[1] + 2);
    fStack_3bc = (float)((ulong)*(undefined8 *)(e[1] + 2) >> 0x20);
    fVar10 = local_3a8 * 0.0 - local_3c8 * 0.0;
    fVar17 = fStack_304 * fStack_3a4 - fStack_344 * fStack_3c4;
    fVar24 = fStack_314 * fStack_3a0 - fStack_354 * fStack_3c0;
    fVar31 = fStack_324 * fStack_39c - fStack_364 * fStack_3bc;
    local_3e8 = (float)*(undefined8 *)*e;
    fStack_3e4 = (float)((ulong)*(undefined8 *)*e >> 0x20);
    fStack_3e0 = (float)*(undefined8 *)(*e + 2);
    fStack_3dc = (float)((ulong)*(undefined8 *)(*e + 2) >> 0x20);
    fVar11 = local_3e8 * 0.0 + local_388 * 0.0;
    fVar18 = fStack_344 * fStack_3e4 + fStack_304 * fStack_384;
    fVar25 = fStack_354 * fStack_3e0 + fStack_314 * fStack_380;
    fVar32 = fStack_364 * fStack_3dc + fStack_324 * fStack_37c;
    local_408 = (float)*(undefined8 *)e[3];
    fStack_404 = (float)((ulong)*(undefined8 *)e[3] >> 0x20);
    fStack_400 = (float)*(undefined8 *)(e[3] + 2);
    fStack_3fc = (float)((ulong)*(undefined8 *)(e[3] + 2) >> 0x20);
    local_428 = (float)*(undefined8 *)e[2];
    fStack_424 = (float)((ulong)*(undefined8 *)e[2] >> 0x20);
    fStack_420 = (float)*(undefined8 *)(e[2] + 2);
    fStack_41c = (float)((ulong)*(undefined8 *)(e[2] + 2) >> 0x20);
    local_448 = (float)*(undefined8 *)e[3];
    fStack_444 = (float)((ulong)*(undefined8 *)e[3] >> 0x20);
    fStack_440 = (float)*(undefined8 *)(e[3] + 2);
    fStack_43c = (float)((ulong)*(undefined8 *)(e[3] + 2) >> 0x20);
    fVar12 = local_428 * 0.0 - local_448 * 0.0;
    fVar19 = fStack_280 * fStack_424 - fStack_2c0 * fStack_444;
    fVar26 = fStack_290 * fStack_420 - fStack_2d0 * fStack_440;
    fVar33 = fStack_2a0 * fStack_41c - fStack_2e0 * fStack_43c;
    local_468 = (float)*(undefined8 *)e[2];
    fStack_464 = (float)((ulong)*(undefined8 *)e[2] >> 0x20);
    fStack_460 = (float)*(undefined8 *)(e[2] + 2);
    fStack_45c = (float)((ulong)*(undefined8 *)(e[2] + 2) >> 0x20);
    fVar13 = local_468 * 0.0 + local_408 * 0.0;
    fVar20 = fStack_2c0 * fStack_464 + fStack_280 * fStack_404;
    fVar27 = fStack_2d0 * fStack_460 + fStack_290 * fStack_400;
    fVar34 = fStack_2e0 * fStack_45c + fStack_2a0 * fStack_3fc;
    local_488 = (float)*(undefined8 *)e[5];
    fStack_484 = (float)((ulong)*(undefined8 *)e[5] >> 0x20);
    fStack_480 = (float)*(undefined8 *)(e[5] + 2);
    fStack_47c = (float)((ulong)*(undefined8 *)(e[5] + 2) >> 0x20);
    local_4a8 = (float)*(undefined8 *)e[4];
    fStack_4a4 = (float)((ulong)*(undefined8 *)e[4] >> 0x20);
    fStack_4a0 = (float)*(undefined8 *)(e[4] + 2);
    fStack_49c = (float)((ulong)*(undefined8 *)(e[4] + 2) >> 0x20);
    local_4c8 = (float)*(undefined8 *)e[5];
    fStack_4c4 = (float)((ulong)*(undefined8 *)e[5] >> 0x20);
    fStack_4c0 = (float)*(undefined8 *)(e[5] + 2);
    fStack_4bc = (float)((ulong)*(undefined8 *)(e[5] + 2) >> 0x20);
    fVar14 = local_4a8 * 0.0 - local_4c8 * 0.0;
    fVar21 = fStack_27c * fStack_4a4 - fStack_2bc * fStack_4c4;
    fVar28 = fStack_28c * fStack_4a0 - fStack_2cc * fStack_4c0;
    fVar35 = fStack_29c * fStack_49c - fStack_2dc * fStack_4bc;
    local_4e8 = (float)*(undefined8 *)e[4];
    fStack_4e4 = (float)((ulong)*(undefined8 *)e[4] >> 0x20);
    fStack_4e0 = (float)*(undefined8 *)(e[4] + 2);
    fStack_4dc = (float)((ulong)*(undefined8 *)(e[4] + 2) >> 0x20);
    fVar15 = local_4e8 * 0.0 + local_488 * 0.0;
    fVar22 = fStack_2bc * fStack_4e4 + fStack_27c * fStack_484;
    fVar29 = fStack_2cc * fStack_4e0 + fStack_28c * fStack_480;
    fVar36 = fStack_2dc * fStack_4dc + fStack_29c * fStack_47c;
    fVar16 = fVar12 + 0.0;
    fVar23 = local_308 + fVar19;
    fVar30 = local_318 + fVar26;
    fVar37 = local_328 + fVar33;
    fVar12 = 0.0 - fVar12;
    local_308 = local_308 - fVar19;
    local_318 = local_318 - fVar26;
    local_328 = local_328 - fVar33;
    fVar19 = fVar10 + fVar14;
    fVar26 = fVar17 + fVar21;
    fVar33 = fVar24 + fVar28;
    fVar38 = fVar31 + fVar35;
    fVar14 = fVar14 - fVar10;
    fVar21 = fVar21 - fVar17;
    fVar28 = fVar28 - fVar24;
    fVar35 = fVar35 - fVar31;
    fVar10 = fVar13 + 0.0;
    fVar24 = local_348 + fVar20;
    fVar31 = local_358 + fVar27;
    fVar39 = local_368 + fVar34;
    fVar13 = 0.0 - fVar13;
    local_348 = local_348 - fVar20;
    local_358 = local_358 - fVar27;
    local_368 = local_368 - fVar34;
    fVar17 = fVar11 + fVar15;
    fVar20 = fVar18 + fVar22;
    fVar27 = fVar25 + fVar29;
    fVar34 = fVar32 + fVar36;
    fVar15 = fVar15 - fVar11;
    fVar22 = fVar22 - fVar18;
    fVar29 = fVar29 - fVar25;
    fVar36 = fVar36 - fVar32;
    i0[3] = fVar23 + fVar26;
    i0[2] = fVar16 + fVar19;
    r0[1] = fVar37 + fVar38;
    r0[0] = fVar30 + fVar33;
    i3[3] = fVar23 - fVar26;
    i3[2] = fVar16 - fVar19;
    r3[1] = fVar37 - fVar38;
    r3[0] = fVar30 - fVar33;
    r1[3] = fVar24 + fVar20;
    r1[2] = fVar10 + fVar17;
    i0[1] = fVar39 + fVar34;
    i0[0] = fVar31 + fVar27;
    sr0[3] = fVar20 - fVar24;
    sr0[2] = fVar17 - fVar10;
    i3[1] = fVar34 - fVar39;
    i3[0] = fVar27 - fVar31;
    i1[3] = local_308 + fVar22;
    i1[2] = fVar12 + fVar15;
    r1[1] = local_328 + fVar36;
    r1[0] = local_318 + fVar29;
    i2[3] = local_308 - fVar22;
    i2[2] = fVar12 - fVar15;
    r2[1] = local_328 - fVar36;
    r2[0] = local_318 - fVar29;
    r2[3] = fVar21 - local_348;
    r2[2] = fVar14 - fVar13;
    i1[1] = fVar35 - local_368;
    i1[0] = fVar28 - local_358;
    r3[3] = fVar21 + local_348;
    r3[2] = fVar14 + fVar13;
    i2[1] = fVar35 + local_368;
    i2[0] = fVar28 + local_358;
    *(undefined8 *)*out = i0._8_8_;
    *(undefined8 *)(*out + 2) = r0._0_8_;
    *(undefined8 *)out[1] = r1._8_8_;
    *(undefined8 *)(out[1] + 2) = i0._0_8_;
    *(undefined8 *)out[2] = i1._8_8_;
    *(undefined8 *)(out[2] + 2) = r1._0_8_;
    *(undefined8 *)out[3] = r2._8_8_;
    *(undefined8 *)(out[3] + 2) = i1._0_8_;
    *(undefined8 *)out[4] = i2._8_8_;
    *(undefined8 *)(out[4] + 2) = r2._0_8_;
    *(undefined8 *)out[5] = r3._8_8_;
    *(undefined8 *)(out[5] + 2) = i2._0_8_;
    *(undefined8 *)out[6] = i3._8_8_;
    *(undefined8 *)(out[6] + 2) = r3._0_8_;
    *(undefined8 *)out[7] = sr0._8_8_;
    *(undefined8 *)(out[7] + 2) = i3._0_8_;
    ci.v[2] = (float)uVar2;
    cr.v[0] = (float)uVar3;
    ci.v[3] = (float)((ulong)uVar2 >> 0x20);
    cr.v[1] = (float)((ulong)uVar3 >> 0x20);
    (*out)[0] = ci.v[2] + cr.v[0] + ci.v[3] + cr.v[1];
    out[1][0] = (ci.v[2] + cr.v[0]) - (ci.v[3] + cr.v[1]);
    out[4][0] = ci.v[2] - cr.v[0];
    out[5][0] = cr.v[1] - ci.v[3];
    uout._0_4_ = (float)uVar4;
    uout._4_4_ = (float)((ulong)uVar4 >> 0x20);
    ci.v[1] = (float)((ulong)uVar5 >> 0x20);
    out[2][0] = (uout._4_4_ - ci.v[1]) * 0.70710677 + uout._0_4_;
    ci.v[0] = (float)uVar5;
    out[3][0] = (uout._4_4_ + ci.v[1]) * -0.70710677 + -ci.v[0];
    out[6][0] = (uout._4_4_ - ci.v[1]) * -0.70710677 + uout._0_4_;
    out[7][0] = (uout._4_4_ + ci.v[1]) * -0.70710677 + ci.v[0];
    for (local_107c = 1; local_107c < iVar6 >> 2; local_107c = local_107c + 1) {
      uVar2 = *(undefined8 *)in[(long)(local_107c << 3) + 7];
      uVar3 = *(undefined8 *)(in[(long)(local_107c << 3) + 7] + 2);
      lVar9 = (long)(local_107c << 3);
      pafVar1 = in + lVar9 + 1;
      pafVar8 = e + local_107c * 6;
      pafVar7 = out + lVar9;
      uVar4 = *(undefined8 *)in[lVar9];
      uVar5 = *(undefined8 *)(in[lVar9] + 2);
      local_b18 = (float)zero._8_8_;
      fStack_b14 = SUB84(zero._8_8_,4);
      local_b28 = (float)*(undefined8 *)*pafVar1;
      fStack_b24 = (float)((ulong)*(undefined8 *)*pafVar1 >> 0x20);
      local_b38 = (float)*(undefined8 *)pafVar1[2];
      fStack_b34 = (float)((ulong)*(undefined8 *)pafVar1[2] >> 0x20);
      local_b48 = (float)*(undefined8 *)pafVar1[4];
      fStack_b44 = (float)((ulong)*(undefined8 *)pafVar1[4] >> 0x20);
      fStack_a90 = (float)save._0_8_;
      fStack_a8c = SUB84(save._0_8_,4);
      fStack_aa0 = (float)*(undefined8 *)(*pafVar1 + 2);
      fStack_a9c = (float)((ulong)*(undefined8 *)(*pafVar1 + 2) >> 0x20);
      fStack_ab0 = (float)*(undefined8 *)(pafVar1[2] + 2);
      fStack_aac = (float)((ulong)*(undefined8 *)(pafVar1[2] + 2) >> 0x20);
      fStack_ac0 = (float)*(undefined8 *)(pafVar1[4] + 2);
      fStack_abc = (float)((ulong)*(undefined8 *)(pafVar1[4] + 2) >> 0x20);
      local_b58 = (float)uVar4;
      fStack_b54 = (float)((ulong)uVar4 >> 0x20);
      local_b68 = (float)*(undefined8 *)pafVar1[1];
      fStack_b64 = (float)((ulong)*(undefined8 *)pafVar1[1] >> 0x20);
      local_b78 = (float)*(undefined8 *)pafVar1[3];
      fStack_b74 = (float)((ulong)*(undefined8 *)pafVar1[3] >> 0x20);
      local_b88 = (float)*(undefined8 *)pafVar1[5];
      fStack_b84 = (float)((ulong)*(undefined8 *)pafVar1[5] >> 0x20);
      fStack_ad0 = (float)uVar5;
      fStack_acc = (float)((ulong)uVar5 >> 0x20);
      fStack_ae0 = (float)*(undefined8 *)(pafVar1[1] + 2);
      fStack_adc = (float)((ulong)*(undefined8 *)(pafVar1[1] + 2) >> 0x20);
      fStack_af0 = (float)*(undefined8 *)(pafVar1[3] + 2);
      fStack_aec = (float)((ulong)*(undefined8 *)(pafVar1[3] + 2) >> 0x20);
      fStack_b00 = (float)*(undefined8 *)(pafVar1[5] + 2);
      fStack_afc = (float)((ulong)*(undefined8 *)(pafVar1[5] + 2) >> 0x20);
      local_ba8 = (float)*(undefined8 *)pafVar8[1];
      fStack_ba4 = (float)((ulong)*(undefined8 *)pafVar8[1] >> 0x20);
      fStack_ba0 = (float)*(undefined8 *)(pafVar8[1] + 2);
      fStack_b9c = (float)((ulong)*(undefined8 *)(pafVar8[1] + 2) >> 0x20);
      local_bc8 = (float)*(undefined8 *)*pafVar8;
      fStack_bc4 = (float)((ulong)*(undefined8 *)*pafVar8 >> 0x20);
      fStack_bc0 = (float)*(undefined8 *)(*pafVar8 + 2);
      fStack_bbc = (float)((ulong)*(undefined8 *)(*pafVar8 + 2) >> 0x20);
      local_be8 = (float)*(undefined8 *)pafVar8[1];
      fStack_be4 = (float)((ulong)*(undefined8 *)pafVar8[1] >> 0x20);
      fStack_be0 = (float)*(undefined8 *)(pafVar8[1] + 2);
      fStack_bdc = (float)((ulong)*(undefined8 *)(pafVar8[1] + 2) >> 0x20);
      fVar10 = fStack_b14 * local_bc8 - fStack_b54 * local_be8;
      fVar17 = fStack_b24 * fStack_bc4 - fStack_b64 * fStack_be4;
      fVar24 = fStack_b34 * fStack_bc0 - fStack_b74 * fStack_be0;
      fVar31 = fStack_b44 * fStack_bbc - fStack_b84 * fStack_bdc;
      local_c08 = (float)*(undefined8 *)*pafVar8;
      fStack_c04 = (float)((ulong)*(undefined8 *)*pafVar8 >> 0x20);
      fStack_c00 = (float)*(undefined8 *)(*pafVar8 + 2);
      fStack_bfc = (float)((ulong)*(undefined8 *)(*pafVar8 + 2) >> 0x20);
      fVar11 = fStack_b54 * local_c08 + fStack_b14 * local_ba8;
      fVar15 = fStack_b64 * fStack_c04 + fStack_b24 * fStack_ba4;
      fVar22 = fStack_b74 * fStack_c00 + fStack_b34 * fStack_ba0;
      fVar29 = fStack_b84 * fStack_bfc + fStack_b44 * fStack_b9c;
      local_c28 = (float)*(undefined8 *)pafVar8[3];
      fStack_c24 = (float)((ulong)*(undefined8 *)pafVar8[3] >> 0x20);
      fStack_c20 = (float)*(undefined8 *)(pafVar8[3] + 2);
      fStack_c1c = (float)((ulong)*(undefined8 *)(pafVar8[3] + 2) >> 0x20);
      local_c48 = (float)*(undefined8 *)pafVar8[2];
      fStack_c44 = (float)((ulong)*(undefined8 *)pafVar8[2] >> 0x20);
      fStack_c40 = (float)*(undefined8 *)(pafVar8[2] + 2);
      fStack_c3c = (float)((ulong)*(undefined8 *)(pafVar8[2] + 2) >> 0x20);
      local_c68 = (float)*(undefined8 *)pafVar8[3];
      fStack_c64 = (float)((ulong)*(undefined8 *)pafVar8[3] >> 0x20);
      fStack_c60 = (float)*(undefined8 *)(pafVar8[3] + 2);
      fStack_c5c = (float)((ulong)*(undefined8 *)(pafVar8[3] + 2) >> 0x20);
      fVar16 = fStack_a90 * local_c48 - fStack_ad0 * local_c68;
      fVar18 = fStack_aa0 * fStack_c44 - fStack_ae0 * fStack_c64;
      fVar25 = fStack_ab0 * fStack_c40 - fStack_af0 * fStack_c60;
      fVar32 = fStack_ac0 * fStack_c3c - fStack_b00 * fStack_c5c;
      local_c88 = (float)*(undefined8 *)pafVar8[2];
      fStack_c84 = (float)((ulong)*(undefined8 *)pafVar8[2] >> 0x20);
      fStack_c80 = (float)*(undefined8 *)(pafVar8[2] + 2);
      fStack_c7c = (float)((ulong)*(undefined8 *)(pafVar8[2] + 2) >> 0x20);
      fVar12 = fStack_ad0 * local_c88 + fStack_a90 * local_c28;
      fVar20 = fStack_ae0 * fStack_c84 + fStack_aa0 * fStack_c24;
      fVar27 = fStack_af0 * fStack_c80 + fStack_ab0 * fStack_c20;
      fVar34 = fStack_b00 * fStack_c7c + fStack_ac0 * fStack_c1c;
      local_ca8 = (float)*(undefined8 *)pafVar8[5];
      fStack_ca4 = (float)((ulong)*(undefined8 *)pafVar8[5] >> 0x20);
      fStack_ca0 = (float)*(undefined8 *)(pafVar8[5] + 2);
      fStack_c9c = (float)((ulong)*(undefined8 *)(pafVar8[5] + 2) >> 0x20);
      local_cc8 = (float)*(undefined8 *)pafVar8[4];
      fStack_cc4 = (float)((ulong)*(undefined8 *)pafVar8[4] >> 0x20);
      fStack_cc0 = (float)*(undefined8 *)(pafVar8[4] + 2);
      fStack_cbc = (float)((ulong)*(undefined8 *)(pafVar8[4] + 2) >> 0x20);
      local_ce8 = (float)*(undefined8 *)pafVar8[5];
      fStack_ce4 = (float)((ulong)*(undefined8 *)pafVar8[5] >> 0x20);
      fStack_ce0 = (float)*(undefined8 *)(pafVar8[5] + 2);
      fStack_cdc = (float)((ulong)*(undefined8 *)(pafVar8[5] + 2) >> 0x20);
      fVar14 = fStack_a8c * local_cc8 - fStack_acc * local_ce8;
      fVar26 = fStack_a9c * fStack_cc4 - fStack_adc * fStack_ce4;
      fVar33 = fStack_aac * fStack_cc0 - fStack_aec * fStack_ce0;
      fVar38 = fStack_abc * fStack_cbc - fStack_afc * fStack_cdc;
      local_d08 = (float)*(undefined8 *)pafVar8[4];
      fStack_d04 = (float)((ulong)*(undefined8 *)pafVar8[4] >> 0x20);
      fStack_d00 = (float)*(undefined8 *)(pafVar8[4] + 2);
      fStack_cfc = (float)((ulong)*(undefined8 *)(pafVar8[4] + 2) >> 0x20);
      fVar13 = fStack_acc * local_d08 + fStack_a8c * local_ca8;
      fVar21 = fStack_adc * fStack_d04 + fStack_a9c * fStack_ca4;
      fVar28 = fStack_aec * fStack_d00 + fStack_aac * fStack_ca0;
      fVar35 = fStack_afc * fStack_cfc + fStack_abc * fStack_c9c;
      fVar19 = local_b18 + fVar16;
      fVar23 = local_b28 + fVar18;
      fVar30 = local_b38 + fVar25;
      fVar37 = local_b48 + fVar32;
      local_b18 = local_b18 - fVar16;
      local_b28 = local_b28 - fVar18;
      local_b38 = local_b38 - fVar25;
      local_b48 = local_b48 - fVar32;
      fVar16 = fVar10 + fVar14;
      fVar18 = fVar17 + fVar26;
      fVar25 = fVar24 + fVar33;
      fVar32 = fVar31 + fVar38;
      fVar14 = fVar14 - fVar10;
      fVar26 = fVar26 - fVar17;
      fVar33 = fVar33 - fVar24;
      fVar38 = fVar38 - fVar31;
      fVar10 = local_b58 + fVar12;
      fVar17 = local_b68 + fVar20;
      fVar24 = local_b78 + fVar27;
      fVar31 = local_b88 + fVar34;
      local_b58 = local_b58 - fVar12;
      local_b68 = local_b68 - fVar20;
      local_b78 = local_b78 - fVar27;
      local_b88 = local_b88 - fVar34;
      fVar12 = fVar11 + fVar13;
      fVar20 = fVar15 + fVar21;
      fVar27 = fVar22 + fVar28;
      fVar34 = fVar29 + fVar35;
      fVar13 = fVar13 - fVar11;
      fVar21 = fVar21 - fVar15;
      fVar28 = fVar28 - fVar22;
      fVar35 = fVar35 - fVar29;
      i0_1[3] = fVar23 + fVar18;
      i0_1[2] = fVar19 + fVar16;
      r0_1[1] = fVar37 + fVar32;
      r0_1[0] = fVar30 + fVar25;
      i3_1[3] = fVar23 - fVar18;
      i3_1[2] = fVar19 - fVar16;
      r3_1[1] = fVar37 - fVar32;
      r3_1[0] = fVar30 - fVar25;
      r1_1[3] = fVar17 + fVar20;
      r1_1[2] = fVar10 + fVar12;
      i0_1[1] = fVar31 + fVar34;
      i0_1[0] = fVar24 + fVar27;
      sr0_1[3] = fVar20 - fVar17;
      sr0_1[2] = fVar12 - fVar10;
      i3_1[1] = fVar34 - fVar31;
      i3_1[0] = fVar27 - fVar24;
      i1_1[3] = local_b28 + fVar21;
      i1_1[2] = local_b18 + fVar13;
      r1_1[1] = local_b48 + fVar35;
      r1_1[0] = local_b38 + fVar28;
      i2_1[3] = local_b28 - fVar21;
      i2_1[2] = local_b18 - fVar13;
      r2_1[1] = local_b48 - fVar35;
      r2_1[0] = local_b38 - fVar28;
      r2_1[3] = fVar26 - local_b68;
      r2_1[2] = fVar14 - local_b58;
      i1_1[1] = fVar38 - local_b88;
      i1_1[0] = fVar33 - local_b78;
      r3_1[3] = fVar26 + local_b68;
      r3_1[2] = fVar14 + local_b58;
      i2_1[1] = fVar38 + local_b88;
      i2_1[0] = fVar33 + local_b78;
      *(undefined8 *)*pafVar7 = i0_1._8_8_;
      *(undefined8 *)(*pafVar7 + 2) = r0_1._0_8_;
      *(undefined8 *)pafVar7[1] = r1_1._8_8_;
      *(undefined8 *)(pafVar7[1] + 2) = i0_1._0_8_;
      *(undefined8 *)pafVar7[2] = i1_1._8_8_;
      *(undefined8 *)(pafVar7[2] + 2) = r1_1._0_8_;
      *(undefined8 *)pafVar7[3] = r2_1._8_8_;
      *(undefined8 *)(pafVar7[3] + 2) = i1_1._0_8_;
      *(undefined8 *)pafVar7[4] = i2_1._8_8_;
      *(undefined8 *)(pafVar7[4] + 2) = r2_1._0_8_;
      *(undefined8 *)pafVar7[5] = r3_1._8_8_;
      *(undefined8 *)(pafVar7[5] + 2) = i2_1._0_8_;
      *(undefined8 *)pafVar7[6] = i3_1._8_8_;
      *(undefined8 *)(pafVar7[6] + 2) = r3_1._0_8_;
      *(undefined8 *)pafVar7[7] = sr0_1._8_8_;
      *(undefined8 *)(pafVar7[7] + 2) = i3_1._0_8_;
      zero._8_8_ = uVar2;
      save._0_8_ = uVar3;
    }
    return;
  }
  __assert_fail("in != out",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                ,0x5cc,"void pffft_real_finalize(int, const v4sf *, v4sf *, const v4sf *)");
}

Assistant:

static NEVER_INLINE(void) pffft_real_finalize(int Ncvec, const v4sf *in, v4sf *out, const v4sf *e) {
  int k, dk = Ncvec/SIMD_SZ; // number of 4x4 matrix blocks
  /* fftpack order is f0r f1r f1i f2r f2i ... f(n-1)r f(n-1)i f(n)r */

  v4sf_union cr, ci, *uout = (v4sf_union*)out;
  v4sf save = in[7], zero=VZERO();
  float xr0, xi0, xr1, xi1, xr2, xi2, xr3, xi3;
  static const float s = M_SQRT2/2;

  cr.v = in[0]; ci.v = in[Ncvec*2-1];
  assert(in != out);
  pffft_real_finalize_4x4(&zero, &zero, in+1, e, out);

  /*
    [cr0 cr1 cr2 cr3 ci0 ci1 ci2 ci3]

    [Xr(1)]  ] [1   1   1   1   0   0   0   0]
    [Xr(N/4) ] [0   0   0   0   1   s   0  -s]
    [Xr(N/2) ] [1   0  -1   0   0   0   0   0]
    [Xr(3N/4)] [0   0   0   0   1  -s   0   s]
    [Xi(1)   ] [1  -1   1  -1   0   0   0   0]
    [Xi(N/4) ] [0   0   0   0   0  -s  -1  -s]
    [Xi(N/2) ] [0  -1   0   1   0   0   0   0]
    [Xi(3N/4)] [0   0   0   0   0  -s   1  -s]
  */

  xr0=(cr.f[0]+cr.f[2]) + (cr.f[1]+cr.f[3]); uout[0].f[0] = xr0;
  xi0=(cr.f[0]+cr.f[2]) - (cr.f[1]+cr.f[3]); uout[1].f[0] = xi0;
  xr2=(cr.f[0]-cr.f[2]);                     uout[4].f[0] = xr2;
  xi2=(cr.f[3]-cr.f[1]);                     uout[5].f[0] = xi2;
  xr1= ci.f[0] + s*(ci.f[1]-ci.f[3]);        uout[2].f[0] = xr1;
  xi1=-ci.f[2] - s*(ci.f[1]+ci.f[3]);        uout[3].f[0] = xi1;
  xr3= ci.f[0] - s*(ci.f[1]-ci.f[3]);        uout[6].f[0] = xr3;
  xi3= ci.f[2] - s*(ci.f[1]+ci.f[3]);        uout[7].f[0] = xi3; 

  for (k=1; k < dk; ++k) {
    v4sf save_next = in[8*k+7];
    pffft_real_finalize_4x4(&save, &in[8*k+0], in + 8*k+1,
                           e + k*6, out + k*8);
    save = save_next;
  }

}